

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O0

int ftxui::anon_unknown_0::CheckStdinReady(int usec_timeout)

{
  fd_set *__arr;
  undefined1 auStack_a0 [4];
  uint __i;
  fd_set fds;
  timeval tv;
  int usec_timeout_local;
  
  fds.fds_bits[0xf] = 0;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    fds.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  _auStack_a0 = _auStack_a0 | 1;
  ::select(1,(fd_set *)auStack_a0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)(fds.fds_bits + 0xf));
  return (int)((_auStack_a0 & 1) != 0);
}

Assistant:

int CheckStdinReady(int usec_timeout) {
  timeval tv = {0, usec_timeout};
  fd_set fds;
  FD_ZERO(&fds);
  FD_SET(STDIN_FILENO, &fds);
  select(STDIN_FILENO + 1, &fds, NULL, NULL, &tv);
  return FD_ISSET(STDIN_FILENO, &fds);
}